

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O3

void acutest_finish_test_line_(acutest_state_ state)

{
  int color;
  char *pcVar1;
  char *pcVar2;
  
  if (acutest_tap_ == '\x01') {
    pcVar1 = "not ok";
    if (state == ACUTEST_STATE_SKIPPED) {
      pcVar1 = "ok";
    }
    pcVar2 = "";
    if (state == ACUTEST_STATE_SKIPPED) {
      pcVar2 = " # SKIP";
    }
    if (state == ACUTEST_STATE_SUCCESS) {
      pcVar1 = "ok";
    }
    printf("%s %d - %s%s\n",pcVar1,(ulong)(acutest_current_index_ + 1),acutest_current_test_->name,
           pcVar2);
    if ((state != ACUTEST_STATE_SUCCESS) || (acutest_timer_ == 0)) {
      return;
    }
    pcVar1 = "# Duration: ";
  }
  else {
    if (state == ACUTEST_STATE_SUCCESS) {
      pcVar1 = "OK";
      color = 0xc;
    }
    else if (state == ACUTEST_STATE_SKIPPED) {
      pcVar1 = "SKIPPED";
      color = 0xd;
    }
    else {
      pcVar1 = "FAILED";
      color = 0xb;
    }
    printf("[ ");
    acutest_colored_printf_(color,"%s",pcVar1);
    printf(" ]");
    if ((state != ACUTEST_STATE_SUCCESS) || (acutest_timer_ == 0)) goto LAB_00102a40;
    pcVar1 = "  ";
  }
  printf(pcVar1);
  printf("%.6lf secs",
         (double)(acutest_timer_end_.tv_nsec - acutest_timer_start_.tv_nsec) / 1000000000.0 +
         (double)(acutest_timer_end_.tv_sec - acutest_timer_start_.tv_sec));
LAB_00102a40:
  putchar(10);
  return;
}

Assistant:

static void
acutest_finish_test_line_(enum acutest_state_ state)
{
    if(acutest_tap_) {
        printf("%s %d - %s%s\n",
                (state == ACUTEST_STATE_SUCCESS || state == ACUTEST_STATE_SKIPPED) ? "ok" : "not ok",
                acutest_current_index_ + 1,
                acutest_current_test_->name,
                (state == ACUTEST_STATE_SKIPPED) ? " # SKIP" : "");

        if(state == ACUTEST_STATE_SUCCESS  &&  acutest_timer_) {
            printf("# Duration: ");
            acutest_timer_print_diff_();
            printf("\n");
        }
    } else {
        int color;
        const char* str;

        switch(state) {
            case ACUTEST_STATE_SUCCESS: color = ACUTEST_COLOR_GREEN_INTENSIVE_; str = "OK"; break;
            case ACUTEST_STATE_SKIPPED: color = ACUTEST_COLOR_YELLOW_INTENSIVE_; str = "SKIPPED"; break;
            case ACUTEST_STATE_FAILED:  /* Fall through. */
            default:                    color = ACUTEST_COLOR_RED_INTENSIVE_; str = "FAILED"; break;
        }

        printf("[ ");
        acutest_colored_printf_(color, "%s", str);
        printf(" ]");

        if(state == ACUTEST_STATE_SUCCESS  &&  acutest_timer_) {
            printf("  ");
            acutest_timer_print_diff_();
        }

        printf("\n");
    }
}